

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O1

void anon_unknown.dwarf_335521::check<Imath_3_2::half>(istream *is,half c)

{
  float *pfVar1;
  float fVar2;
  ostream *poVar3;
  long *plVar4;
  uchar b [2];
  half local_1a;
  
  std::istream::read((char *)is,(long)&local_1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N9Imath_3_24halfE",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": expected ",0xb);
  poVar3 = (ostream *)::operator<<((ostream *)&std::cout,c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", got ",6);
  plVar4 = (long *)::operator<<(poVar3,local_1a);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  fVar2 = *(float *)(_imath_half_to_float_table + (ulong)c._h * 4);
  pfVar1 = (float *)(_imath_half_to_float_table + (ulong)local_1a._h * 4);
  if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = Imath_3_2::half]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}